

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-common.cpp
# Opt level: O0

void __thiscall Dashel::ParameterSet::add(ParameterSet *this,char *line)

{
  char *pcVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  reference __k;
  char *pcVar4;
  allocator<char> local_c9;
  value_type local_c8;
  allocator<char> local_a1;
  value_type local_a0;
  allocator<char> local_69;
  key_type local_68;
  char *local_48;
  char *sep;
  char *protocolName;
  char *pcStack_30;
  bool storeParams;
  char *param;
  char *pcStack_20;
  int spc;
  char *lc;
  char *line_local;
  ParameterSet *this_local;
  
  lc = line;
  line_local = (char *)this;
  pcStack_20 = strdup(line);
  param._4_4_ = 0;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->params);
  protocolName._7_1_ = sVar2 == 0;
  sep = strtok(pcStack_20,":");
  if (sep == (char *)0x0) {
    __assert_fail("protocolName",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/aseba-community[P]dashel/dashel/dashel-common.cpp"
                  ,0xe8,"void Dashel::ParameterSet::add(const char *)");
  }
  while (pcStack_30 = strtok((char *)0x0,";"), pcStack_30 != (char *)0x0) {
    local_48 = strchr(pcStack_30,0x3d);
    pcVar1 = pcStack_30;
    if (local_48 == (char *)0x0) {
      if ((protocolName._7_1_ & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,pcVar1,&local_c9);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->params,&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::allocator<char>::~allocator(&local_c9);
      }
      pcVar1 = pcStack_30;
      __k = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&this->params,(long)param._4_4_);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->values,__k);
      std::__cxx11::string::operator=((string *)pmVar3,pcVar1);
    }
    else {
      pcVar4 = local_48 + 1;
      *local_48 = '\0';
      local_48 = pcVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pcVar1,&local_69);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->values,&local_68);
      std::__cxx11::string::operator=((string *)pmVar3,pcVar4);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator(&local_69);
      pcVar1 = pcStack_30;
      if ((protocolName._7_1_ & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,pcVar1,&local_a1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->params,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::allocator<char>::~allocator(&local_a1);
      }
    }
    param._4_4_ = param._4_4_ + 1;
  }
  free(pcStack_20);
  return;
}

Assistant:

void ParameterSet::add(const char* line)
	{
		char* lc = strdup(line);
		int spc = 0;
		char* param;
		bool storeParams = (params.size() == 0);
		char* protocolName = strtok(lc, ":");

		// Do nothing with this.
		assert(protocolName);

		while ((param = strtok(NULL, ";")) != NULL)
		{
			char* sep = strchr(param, '=');
			if (sep)
			{
				*sep++ = 0;
				values[param] = sep;
				if (storeParams)
					params.push_back(param);
			}
			else
			{
				if (storeParams)
					params.push_back(param);
				values[params[spc]] = param;
			}
			++spc;
		}

		free(lc);
	}